

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,ExtensionInfo *extension,CodedInputStream *input,
          FieldSkipper *field_skipper)

{
  uint8 uVar1;
  uint8 *puVar2;
  LogLevel *pLVar3;
  double *pdVar4;
  float *pfVar5;
  bool bVar6;
  Limit LVar7;
  int iVar8;
  LogMessage *other;
  string *psVar9;
  MessageLite *pMVar10;
  FieldType FVar11;
  double dVar12;
  FieldDescriptor *pFVar13;
  LogLevel LVar14;
  float value;
  uint32 temp;
  uint32 size;
  LogMessage local_70;
  LogFinisher local_35;
  uint32 local_34;
  
  if (extension->is_packed == true) {
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      local_34 = (int)(char)uVar1;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_34);
      if (!bVar6) {
        return false;
      }
    }
    LVar7 = io::CodedInputStream::PushLimit(input,local_34);
    switch(extension->type) {
    case '\x01':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          pdVar4 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
            bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
            dVar12 = (double)local_70._0_8_;
            if (!bVar6) {
              return false;
            }
          }
          else {
            dVar12 = *pdVar4;
            input->buffer_ = (uint8 *)(pdVar4 + 1);
          }
          AddDouble(this,number,'\x01',true,dVar12,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x02':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          pfVar5 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar5 < 4) {
            bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
            if (!bVar6) {
              return false;
            }
            value = (float)local_70.level_;
          }
          else {
            value = *pfVar5;
            input->buffer_ = (uint8 *)(pfVar5 + 1);
          }
          AddFloat(this,number,'\x02',true,value,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x03':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar2 = input->buffer_;
          if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
            input->buffer_ = puVar2 + 1;
            dVar12 = (double)(long)(char)uVar1;
          }
          else {
            bVar6 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_70);
            dVar12 = (double)local_70._0_8_;
            if (!bVar6) {
              return false;
            }
          }
          AddInt64(this,number,'\x03',true,(int64)dVar12,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x04':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar2 = input->buffer_;
          if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
            input->buffer_ = puVar2 + 1;
            local_70._0_8_ = (long)(char)uVar1;
          }
          else {
            bVar6 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_70);
            if (!bVar6) {
              return false;
            }
          }
          AddUInt64(this,number,'\x04',true,local_70._0_8_,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x05':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar2 = input->buffer_;
          if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
            input->buffer_ = puVar2 + 1;
            LVar14 = (int)(char)uVar1;
          }
          else {
            bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
            if (!bVar6) {
              return false;
            }
            LVar14 = local_70.level_;
          }
          AddInt32(this,number,'\x05',true,LVar14,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x06':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          pdVar4 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
            bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
            if (!bVar6) {
              return false;
            }
          }
          else {
            local_70._0_8_ = *pdVar4;
            input->buffer_ = (uint8 *)(pdVar4 + 1);
          }
          AddUInt64(this,number,'\x06',true,local_70._0_8_,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\a':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          pLVar3 = (LogLevel *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pLVar3 < 4) {
            bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
            if (!bVar6) {
              return false;
            }
            LVar14 = local_70.level_;
          }
          else {
            LVar14 = *pLVar3;
            local_70.level_ = LVar14;
            input->buffer_ = (uint8 *)(pLVar3 + 1);
          }
          AddUInt32(this,number,'\a',true,LVar14,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\b':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar2 = input->buffer_;
          if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
            input->buffer_ = puVar2 + 1;
            LVar14 = (int)(char)uVar1;
          }
          else {
            bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
            if (!bVar6) {
              return false;
            }
            LVar14 = local_70.level_;
          }
          AddBool(this,number,'\b',true,LVar14 != LOGLEVEL_INFO,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3ae);
      other = LogMessage::operator<<(&local_70,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_35,other);
      LogMessage::~LogMessage(&local_70);
      break;
    case '\r':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar2 = input->buffer_;
          if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
            local_70.level_ = (int)(char)uVar1;
            input->buffer_ = puVar2 + 1;
            LVar14 = (int)(char)uVar1;
          }
          else {
            bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
            if (!bVar6) {
              return false;
            }
            LVar14 = local_70.level_;
          }
          AddUInt32(this,number,'\r',true,LVar14,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x0e':
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
          input->buffer_ = puVar2 + 1;
          LVar14 = (int)(char)uVar1;
        }
        else {
          bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
          if (!bVar6) {
            return false;
          }
          LVar14 = local_70.level_;
        }
        bVar6 = (*(extension->field_3).enum_validity_check.func)
                          ((extension->field_3).enum_validity_check.arg,LVar14);
        if (bVar6) {
          AddEnum(this,number,'\x0e',true,LVar14,extension->descriptor);
        }
      }
      break;
    case '\x0f':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          pLVar3 = (LogLevel *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pLVar3 < 4) {
            bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
            if (!bVar6) {
              return false;
            }
            LVar14 = local_70.level_;
          }
          else {
            LVar14 = *pLVar3;
            input->buffer_ = (uint8 *)(pLVar3 + 1);
          }
          AddInt32(this,number,'\x0f',true,LVar14,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x10':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          pdVar4 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
            bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
            dVar12 = (double)local_70._0_8_;
            if (!bVar6) {
              return false;
            }
          }
          else {
            dVar12 = *pdVar4;
            input->buffer_ = (uint8 *)(pdVar4 + 1);
          }
          AddInt64(this,number,'\x10',true,(int64)dVar12,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x11':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar2 = input->buffer_;
          if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
            input->buffer_ = puVar2 + 1;
            LVar14 = (int)(char)uVar1;
          }
          else {
            bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
            if (!bVar6) {
              return false;
            }
            LVar14 = local_70.level_;
          }
          AddInt32(this,number,'\x11',true,-(LVar14 & LOGLEVEL_WARNING) ^ LVar14 >> 1,
                   extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x12':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar2 = input->buffer_;
          if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
            input->buffer_ = puVar2 + 1;
            dVar12 = (double)(long)(char)uVar1;
          }
          else {
            bVar6 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_70);
            dVar12 = (double)local_70._0_8_;
            if (!bVar6) {
              return false;
            }
          }
          AddInt64(this,number,'\x12',true,-(ulong)(SUB84(dVar12,0) & 1) ^ (ulong)dVar12 >> 1,
                   extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
    }
    io::CodedInputStream::PopLimit(input,LVar7);
    return true;
  }
  switch(extension->type) {
  case '\x01':
    pdVar4 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
      bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
      if (!bVar6) {
        return false;
      }
    }
    else {
      local_70._0_8_ = *pdVar4;
      input->buffer_ = (uint8 *)(pdVar4 + 1);
    }
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',false,(double)local_70._0_8_,extension->descriptor);
    }
    else {
      SetDouble(this,number,'\x01',(double)local_70._0_8_,extension->descriptor);
    }
    break;
  case '\x02':
    pfVar5 = (float *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pfVar5 < 4) {
      bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
      if (!bVar6) {
        return false;
      }
    }
    else {
      local_70.level_ = (LogLevel)*pfVar5;
      input->buffer_ = (uint8 *)(pfVar5 + 1);
    }
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',false,(float)local_70.level_,extension->descriptor);
    }
    else {
      SetFloat(this,number,'\x02',(float)local_70.level_,extension->descriptor);
    }
    break;
  case '\x03':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      local_70._0_8_ = (long)(char)uVar1;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_70);
      if (!bVar6) {
        return false;
      }
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar11 = '\x03';
LAB_00119872:
      SetInt64(this,number,FVar11,local_70._0_8_,pFVar13);
      return true;
    }
    FVar11 = '\x03';
    goto LAB_0011985c;
  case '\x04':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      local_70._0_8_ = (long)(char)uVar1;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_70);
      if (!bVar6) {
        return false;
      }
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar11 = '\x04';
LAB_001197a8:
      SetUInt64(this,number,FVar11,local_70._0_8_,pFVar13);
      return true;
    }
    FVar11 = '\x04';
    goto LAB_00119792;
  case '\x05':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      local_70.level_ = (int)(char)uVar1;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
      if (!bVar6) {
        return false;
      }
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar11 = '\x05';
LAB_001196b5:
      SetInt32(this,number,FVar11,local_70.level_,pFVar13);
      return true;
    }
    FVar11 = '\x05';
    goto LAB_0011969f;
  case '\x06':
    pdVar4 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
      bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
      if (!bVar6) {
        return false;
      }
    }
    else {
      local_70._0_8_ = *pdVar4;
      input->buffer_ = (uint8 *)(pdVar4 + 1);
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar11 = '\x06';
      goto LAB_001197a8;
    }
    FVar11 = '\x06';
LAB_00119792:
    AddUInt64(this,number,FVar11,false,local_70._0_8_,pFVar13);
    break;
  case '\a':
    puVar2 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar2 < 4) {
      bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
      if (!bVar6) {
        return false;
      }
    }
    else {
      local_70.level_ = *(undefined4 *)puVar2;
      input->buffer_ = puVar2 + 4;
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar11 = '\a';
LAB_0011970c:
      SetUInt32(this,number,FVar11,local_70.level_,pFVar13);
      return true;
    }
    FVar11 = '\a';
    goto LAB_001196f6;
  case '\b':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      local_70.level_ = (int)(char)uVar1;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
      if (!bVar6) {
        return false;
      }
    }
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',false,local_70.level_ != LOGLEVEL_INFO,extension->descriptor);
    }
    else {
      SetBool(this,number,'\b',local_70.level_ != LOGLEVEL_INFO,extension->descriptor);
    }
    break;
  case '\t':
    if (extension->is_repeated == true) {
      psVar9 = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      psVar9 = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    bVar6 = WireFormatLite::ReadString(input,psVar9);
    goto LAB_001195a9;
  case '\n':
    if (extension->is_repeated == true) {
      pMVar10 = AddMessage(this,number,'\n',(extension->field_3).message_prototype,
                           extension->descriptor);
    }
    else {
      pMVar10 = MutableMessage(this,number,'\n',(extension->field_3).message_prototype,
                               extension->descriptor);
    }
    iVar8 = input->recursion_depth_;
    input->recursion_depth_ = iVar8 + 1;
    if (input->recursion_limit_ <= iVar8) {
      return false;
    }
    iVar8 = (*pMVar10->_vptr_MessageLite[8])(pMVar10,input);
    if ((char)iVar8 == '\0') {
      return false;
    }
    if (0 < input->recursion_depth_) {
      input->recursion_depth_ = input->recursion_depth_ + -1;
    }
    if (input->last_tag_ != number * 8 + 4U) {
      return false;
    }
    return true;
  case '\v':
    if (extension->is_repeated == true) {
      pMVar10 = AddMessage(this,number,'\v',(extension->field_3).message_prototype,
                           extension->descriptor);
    }
    else {
      pMVar10 = MutableMessage(this,number,'\v',(extension->field_3).message_prototype,
                               extension->descriptor);
    }
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
      local_70.level_ = (int)(char)*puVar2;
      input->buffer_ = puVar2 + 1;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
      if (!bVar6) {
        return false;
      }
    }
    iVar8 = input->recursion_depth_;
    input->recursion_depth_ = iVar8 + 1;
    if (input->recursion_limit_ <= iVar8) {
      return false;
    }
    LVar7 = io::CodedInputStream::PushLimit(input,local_70.level_);
    iVar8 = (*pMVar10->_vptr_MessageLite[8])(pMVar10,input);
    if ((char)iVar8 == '\0') {
      return false;
    }
    if (input->legitimate_message_end_ != true) {
      return false;
    }
    io::CodedInputStream::PopLimit(input,LVar7);
    if (input->recursion_depth_ < 1) {
      return true;
    }
    input->recursion_depth_ = input->recursion_depth_ + -1;
    return true;
  case '\f':
    if (extension->is_repeated == true) {
      psVar9 = AddString_abi_cxx11_(this,number,'\f',extension->descriptor);
    }
    else {
      psVar9 = MutableString_abi_cxx11_(this,number,'\f',extension->descriptor);
    }
    bVar6 = WireFormatLite::ReadBytes(input,psVar9);
LAB_001195a9:
    if (bVar6 == false) {
      return false;
    }
    break;
  case '\r':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
      local_70.level_ = (int)(char)*puVar2;
      input->buffer_ = puVar2 + 1;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
      if (!bVar6) {
        return false;
      }
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar11 = '\r';
      goto LAB_0011970c;
    }
    FVar11 = '\r';
LAB_001196f6:
    AddUInt32(this,number,FVar11,false,local_70.level_,pFVar13);
    break;
  case '\x0e':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      LVar14 = (int)(char)uVar1;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
      if (!bVar6) {
        return false;
      }
      LVar14 = local_70.level_;
    }
    bVar6 = (*(extension->field_3).enum_validity_check.func)
                      ((extension->field_3).enum_validity_check.arg,LVar14);
    if (bVar6) {
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',false,LVar14,extension->descriptor);
      }
      else {
        SetEnum(this,number,'\x0e',LVar14,extension->descriptor);
      }
    }
    else {
      (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,(ulong)LVar14);
    }
    break;
  case '\x0f':
    pLVar3 = (LogLevel *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pLVar3 < 4) {
      bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
      if (!bVar6) {
        return false;
      }
    }
    else {
      local_70.level_ = *pLVar3;
      input->buffer_ = (uint8 *)(pLVar3 + 1);
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar11 = '\x0f';
      goto LAB_001196b5;
    }
    FVar11 = '\x0f';
    goto LAB_0011969f;
  case '\x10':
    pdVar4 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
      bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
      if (!bVar6) {
        return false;
      }
    }
    else {
      local_70._0_8_ = *pdVar4;
      input->buffer_ = (uint8 *)(pdVar4 + 1);
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar11 = '\x10';
      goto LAB_00119872;
    }
    FVar11 = '\x10';
    goto LAB_0011985c;
  case '\x11':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      local_70.level_ = (int)(char)uVar1;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_70.level_);
      if (!bVar6) {
        return false;
      }
    }
    local_70.level_ = -(local_70.level_ & LOGLEVEL_WARNING) ^ local_70.level_ >> 1;
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar11 = '\x11';
      goto LAB_001196b5;
    }
    FVar11 = '\x11';
LAB_0011969f:
    AddInt32(this,number,FVar11,false,local_70.level_,pFVar13);
    break;
  case '\x12':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      local_70._0_8_ = (long)(char)uVar1;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_70);
      if (!bVar6) {
        return false;
      }
    }
    local_70._0_8_ = -(ulong)((uint)local_70._0_8_ & 1) ^ (ulong)local_70._0_8_ >> 1;
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar11 = '\x12';
      goto LAB_00119872;
    }
    FVar11 = '\x12';
LAB_0011985c:
    AddInt64(this,number,FVar11,false,local_70._0_8_,pFVar13);
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(
    int number, const ExtensionInfo& extension,
    io::CodedInputStream* input,
    FieldSkipper* field_skipper) {
  if (extension.is_packed) {
    uint32 size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)        \
      case WireFormatLite::TYPE_##UPPERCASE:                                   \
        while (input->BytesUntilLimit() > 0) {                                 \
          CPP_LOWERCASE value;                                                 \
          if (!WireFormatLite::ReadPrimitive<                                  \
                  CPP_LOWERCASE, WireFormatLite::TYPE_##UPPERCASE>(            \
                input, &value)) return false;                                  \
          Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,         \
                             true, value, extension.descriptor);               \
        }                                                                      \
        break

      HANDLE_TYPE(   INT32,  Int32,   int32);
      HANDLE_TYPE(   INT64,  Int64,   int64);
      HANDLE_TYPE(  UINT32, UInt32,  uint32);
      HANDLE_TYPE(  UINT64, UInt64,  uint64);
      HANDLE_TYPE(  SINT32,  Int32,   int32);
      HANDLE_TYPE(  SINT64,  Int64,   int64);
      HANDLE_TYPE( FIXED32, UInt32,  uint32);
      HANDLE_TYPE( FIXED64, UInt64,  uint64);
      HANDLE_TYPE(SFIXED32,  Int32,   int32);
      HANDLE_TYPE(SFIXED64,  Int64,   int64);
      HANDLE_TYPE(   FLOAT,  Float,   float);
      HANDLE_TYPE(  DOUBLE, Double,  double);
      HANDLE_TYPE(    BOOL,   Bool,    bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value)) return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, true, value,
                    extension.descriptor);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                   \
      case WireFormatLite::TYPE_##UPPERCASE: {                                 \
        CPP_LOWERCASE value;                                                   \
        if (!WireFormatLite::ReadPrimitive<                                    \
                CPP_LOWERCASE, WireFormatLite::TYPE_##UPPERCASE>(              \
               input, &value)) return false;                                   \
        if (extension.is_repeated) {                                          \
          Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,         \
                             false, value, extension.descriptor);              \
        } else {                                                               \
          Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,  \
                             extension.descriptor);                            \
        }                                                                      \
      } break

      HANDLE_TYPE(   INT32,  Int32,   int32);
      HANDLE_TYPE(   INT64,  Int64,   int64);
      HANDLE_TYPE(  UINT32, UInt32,  uint32);
      HANDLE_TYPE(  UINT64, UInt64,  uint64);
      HANDLE_TYPE(  SINT32,  Int32,   int32);
      HANDLE_TYPE(  SINT64,  Int64,   int64);
      HANDLE_TYPE( FIXED32, UInt32,  uint32);
      HANDLE_TYPE( FIXED64, UInt64,  uint64);
      HANDLE_TYPE(SFIXED32,  Int32,   int32);
      HANDLE_TYPE(SFIXED64,  Int64,   int64);
      HANDLE_TYPE(   FLOAT,  Float,   float);
      HANDLE_TYPE(  DOUBLE, Double,  double);
      HANDLE_TYPE(    BOOL,   Bool,    bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value)) return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, false, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING:  {
        string* value = extension.is_repeated ?
          AddString(number, WireFormatLite::TYPE_STRING, extension.descriptor) :
          MutableString(number, WireFormatLite::TYPE_STRING,
                        extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES:  {
        string* value = extension.is_repeated ?
          AddString(number, WireFormatLite::TYPE_BYTES, extension.descriptor) :
          MutableString(number, WireFormatLite::TYPE_BYTES,
                        extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value = extension.is_repeated ?
            AddMessage(number, WireFormatLite::TYPE_GROUP,
                       *extension.message_prototype, extension.descriptor) :
            MutableMessage(number, WireFormatLite::TYPE_GROUP,
                           *extension.message_prototype, extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value = extension.is_repeated ?
            AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                       *extension.message_prototype, extension.descriptor) :
            MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                           *extension.message_prototype, extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}